

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_avgdev.c
# Opt level: O1

ErrorNumber test_func_avgdev(TA_History *history)

{
  TA_RetCode TVar1;
  ErrorNumber EVar2;
  ulong uVar3;
  ulong uVar4;
  TA_Test_conflict3 *pTVar5;
  TA_Integer outNbElement;
  TA_Integer outBegIdx;
  TA_Test_conflict3 *local_40;
  TA_Real *local_38;
  
  pTVar5 = tableTest;
  uVar3 = 0;
  do {
    if ((int)history->nbBars < pTVar5->expectedNbElement) {
      printf("%s Failed Bad Parameter for Test #%d (%d,%d)\n",
             "/workspace/llm4binary/github/license_c_cmakelists/TA-Lib[P]ta-lib/src/tools/ta_regtest/ta_test_func/test_avgdev.c"
             ,uVar3 & 0xffffffff);
      return TA_TESTUTIL_TFRR_BAD_PARAM;
    }
    clearAllBuffers();
    setInputBuffer(0,history->close,history->nbBars);
    setInputBuffer(1,history->close,history->nbBars);
    TVar1 = TA_AVGDEV(pTVar5->startIdx,pTVar5->endIdx,gBuffer[0].in,pTVar5->optInTimePeriod,
                      &outBegIdx,&outNbElement,gBuffer[0].out0);
    EVar2 = checkDataSame(gBuffer[0].in,history->close,history->nbBars);
    if (EVar2 == TA_TEST_PASS) {
      EVar2 = checkExpectedValue(gBuffer[0].out0,TVar1,pTVar5->expectedRetCode,outBegIdx,
                                 pTVar5->expectedBegIdx,outNbElement,pTVar5->expectedNbElement,
                                 pTVar5->oneOfTheExpectedOutReal0,
                                 pTVar5->oneOfTheExpectedOutRealIndex0);
      if (EVar2 == TA_TEST_PASS) {
        outNbElement = 0;
        outBegIdx = 0;
        TVar1 = TA_AVGDEV(pTVar5->startIdx,pTVar5->endIdx,gBuffer[1].in,pTVar5->optInTimePeriod,
                          &outBegIdx,&outNbElement,gBuffer[1].in);
        EVar2 = checkSameContent(gBuffer[0].out0,gBuffer[1].in);
        if (EVar2 != TA_TEST_PASS) goto LAB_00115a30;
        EVar2 = checkExpectedValue(gBuffer[1].in,TVar1,pTVar5->expectedRetCode,outBegIdx,
                                   pTVar5->expectedBegIdx,outNbElement,pTVar5->expectedNbElement,
                                   pTVar5->oneOfTheExpectedOutReal0,
                                   pTVar5->oneOfTheExpectedOutRealIndex0);
        if (EVar2 != TA_TEST_PASS) goto LAB_00115a6a;
        local_38 = history->close;
        local_40 = pTVar5;
        if ((pTVar5->doRangeTestFlag != 0) &&
           (EVar2 = doRangeTest(rangeTestFunction,TA_FUNC_UNST_NONE,&local_40,1,0),
           EVar2 != TA_TEST_PASS)) goto LAB_00115a30;
        uVar4 = 0;
      }
      else {
LAB_00115a6a:
        uVar4 = (ulong)EVar2;
        printf("Fail for output id=%d\n",0);
      }
    }
    else {
LAB_00115a30:
      uVar4 = (ulong)EVar2;
    }
    if ((ErrorNumber)uVar4 != TA_TEST_PASS) {
      printf("%s Failed Test #%d (Code=%d)\n",
             "/workspace/llm4binary/github/license_c_cmakelists/TA-Lib[P]ta-lib/src/tools/ta_regtest/ta_test_func/test_avgdev.c"
             ,uVar3 & 0xffffffff,uVar4);
      return (ErrorNumber)uVar4;
    }
    uVar3 = uVar3 + 1;
    pTVar5 = pTVar5 + 1;
    if (uVar3 == 3) {
      return TA_TEST_PASS;
    }
  } while( true );
}

Assistant:

ErrorNumber test_func_avgdev( TA_History *history )
{
   unsigned int i;
   ErrorNumber retValue;

   for( i=0; i < NB_TEST; i++ )
   {
      if( (int)tableTest[i].expectedNbElement > (int)history->nbBars )
      {
         printf( "%s Failed Bad Parameter for Test #%d (%d,%d)\n", __FILE__,
                 i, tableTest[i].expectedNbElement, history->nbBars );
         return TA_TESTUTIL_TFRR_BAD_PARAM;
      }

      retValue = do_test( history, &tableTest[i] );
      if( retValue != 0 )
      {
         printf( "%s Failed Test #%d (Code=%d)\n", __FILE__,
                 i, retValue );
         return retValue;
      }
   }

   /* All test succeed. */
   return TA_TEST_PASS;
}